

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca.cpp
# Opt level: O0

void dfs(int a)

{
  int a_00;
  bool bVar1;
  reference piVar2;
  iterator iStack_28;
  int b;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int a_local;
  
  __end1 = std::vector<int,_std::allocator<int>_>::begin(g + a);
  iStack_28 = std::vector<int,_std::allocator<int>_>::end(g + a);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd8), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    a_00 = *piVar2;
    if (a_00 != pred[a][0]) {
      d[a_00] = d[a] + 1;
      pred[a_00][0] = a;
      dfs(a_00);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void dfs(int a) {
    for (auto b : g[a]) {
        if (b == pred[a][0]) continue;
        d[b] = d[a] + 1;
        pred[b][0] = a;
        dfs(b);
    }
}